

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::lazyPrint(ConsoleReporter *this)

{
  if ((this->super_StreamingReporterBase).testRunInfo.nullableValue != (TestRunInfo *)0x0) {
    lazyPrintRunInfo(this);
  }
  if ((this->super_StreamingReporterBase).unusedGroupInfo.nullableValue != (GroupInfo *)0x0) {
    lazyPrintGroupInfo(this);
  }
  if (this->m_headerPrinted == false) {
    printTestCaseAndSectionHeader(this);
    this->m_headerPrinted = true;
  }
  this->m_atLeastOneTestCasePrinted = true;
  return;
}

Assistant:

void lazyPrint() {

            if( testRunInfo )
                lazyPrintRunInfo();
            if( unusedGroupInfo )
                lazyPrintGroupInfo();

            if( !m_headerPrinted ) {
                printTestCaseAndSectionHeader();
                m_headerPrinted = true;
            }
            m_atLeastOneTestCasePrinted = true;
        }